

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

void __thiscall Imf_2_5::SampleCountChannel::set(SampleCountChannel *this,int r,uint *newNumSamples)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = (((this->super_ImageChannel)._level)->_dataWindow).min.x;
  for (lVar2 = 0; lVar2 < (this->super_ImageChannel)._pixelsPerRow; lVar2 = lVar2 + 1) {
    set(this,iVar1 + (int)lVar2,r + iVar1,newNumSamples[lVar2]);
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int r, unsigned int newNumSamples[])
{
    int x = level().dataWindow().min.x;
    int y = r + level().dataWindow().min.x;

    for (int i = 0; i < pixelsPerRow(); ++i, ++x)
        set (x, y, newNumSamples[i]);
}